

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::branch
          (CompilerGLSL *this,BlockID from,uint32_t cond,BlockID true_block,BlockID false_block)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool local_c9;
  bool local_c1;
  undefined1 local_b0 [100];
  uint32_t local_4c;
  uint32_t local_48;
  bool local_41;
  uint32_t local_40;
  uint32_t uStack_3c;
  bool false_block_needs_code;
  bool local_35;
  TypedID<(spirv_cross::Types)6> local_34;
  bool true_block_needs_code;
  SPIRBlock *pSStack_30;
  BlockID merge_block;
  SPIRBlock *from_block;
  uint32_t cond_local;
  CompilerGLSL *this_local;
  BlockID local_10;
  BlockID false_block_local;
  BlockID true_block_local;
  BlockID from_local;
  
  this_local._4_4_ = false_block.id;
  local_10.id = true_block.id;
  false_block_local = from;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&false_block_local);
  pSStack_30 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar1);
  if (pSStack_30->merge == MergeSelection) {
    local_34.id = (pSStack_30->next_block).id;
  }
  else {
    TypedID<(spirv_cross::Types)6>::TypedID(&local_34,0);
  }
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_10);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_34);
  local_c1 = true;
  if (uVar1 == uVar2) {
    uStack_3c = false_block_local.id;
    local_40 = local_10.id;
    local_c1 = Compiler::flush_phi_required(&this->super_Compiler,false_block_local,local_10);
  }
  local_35 = local_c1;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_34);
  local_c9 = true;
  if (uVar1 == uVar2) {
    local_48 = false_block_local.id;
    local_4c = this_local._4_4_;
    local_c9 = Compiler::flush_phi_required
                         (&this->super_Compiler,false_block_local,this_local._4_4_);
  }
  local_41 = local_c9;
  if (((local_35 & 1U) != 0) || (local_c9 != false)) {
    if ((pSStack_30->hint == HintFlatten) || (pSStack_30->hint == HintDontFlatten)) {
      (*(this->super_Compiler)._vptr_Compiler[0x35])(this,pSStack_30);
    }
    if ((local_35 & 1U) == 0) {
      if ((local_41 & 1U) != 0) {
        to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_b0,(uint32_t)this,SUB41(cond,0));
        statement<char_const(&)[6],std::__cxx11::string,char_const(&)[2]>
                  (this,(char (*) [6])"if (!",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   (char (*) [2])0x5b48c4);
        ::std::__cxx11::string::~string((string *)local_b0);
        begin_scope(this);
        branch(this,false_block_local,this_local._4_4_);
        end_scope(this);
      }
    }
    else {
      to_expression_abi_cxx11_((CompilerGLSL *)(local_b0 + 0x40),(uint32_t)this,SUB41(cond,0));
      statement<char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
                (this,(char (*) [5])"if (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b0 + 0x40),(char (*) [2])0x5b48c4);
      ::std::__cxx11::string::~string((string *)(local_b0 + 0x40));
      begin_scope(this);
      local_b0._48_4_ = false_block_local.id;
      local_b0._44_4_ = local_10.id;
      branch(this,false_block_local,local_10);
      end_scope(this);
      if ((local_41 & 1U) != 0) {
        statement<char_const(&)[5]>(this,(char (*) [5])0x5ad365);
        begin_scope(this);
        local_b0._40_4_ = false_block_local.id;
        local_b0._36_4_ = this_local._4_4_;
        branch(this,false_block_local,this_local._4_4_);
        end_scope(this);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::branch(BlockID from, uint32_t cond, BlockID true_block, BlockID false_block)
{
	auto &from_block = get<SPIRBlock>(from);
	BlockID merge_block = from_block.merge == SPIRBlock::MergeSelection ? from_block.next_block : BlockID(0);

	// If we branch directly to our selection merge target, we don't need a code path.
	bool true_block_needs_code = true_block != merge_block || flush_phi_required(from, true_block);
	bool false_block_needs_code = false_block != merge_block || flush_phi_required(from, false_block);

	if (!true_block_needs_code && !false_block_needs_code)
		return;

	// We might have a loop merge here. Only consider selection flattening constructs.
	// Loop hints are handled explicitly elsewhere.
	if (from_block.hint == SPIRBlock::HintFlatten || from_block.hint == SPIRBlock::HintDontFlatten)
		emit_block_hints(from_block);

	if (true_block_needs_code)
	{
		statement("if (", to_expression(cond), ")");
		begin_scope();
		branch(from, true_block);
		end_scope();

		if (false_block_needs_code)
		{
			statement("else");
			begin_scope();
			branch(from, false_block);
			end_scope();
		}
	}
	else if (false_block_needs_code)
	{
		// Only need false path, use negative conditional.
		statement("if (!", to_enclosed_expression(cond), ")");
		begin_scope();
		branch(from, false_block);
		end_scope();
	}
}